

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_sofa_c.c
# Opt level: O0

int main(int argc,char **argv)

{
  int *in_RSI;
  int in_EDI;
  int status;
  int *unaff_retaddr;
  undefined4 in_stack_00000014;
  int *in_stack_00000020;
  int *in_stack_00000030;
  int *in_stack_00000040;
  int *in_stack_00000050;
  int *in_stack_00000060;
  int *in_stack_00000070;
  int *in_stack_00000080;
  int *in_stack_00000090;
  int *in_stack_000000a0;
  int *in_stack_000000b0;
  int *in_stack_000000c0;
  int *in_stack_000000d0;
  int *in_stack_000000e0;
  int *in_stack_000000f0;
  int *in_stack_00000110;
  int *in_stack_00000120;
  int *in_stack_00000130;
  int *in_stack_00000140;
  int *in_stack_00000150;
  int *in_stack_00000160;
  int *in_stack_00000170;
  int *in_stack_00000180;
  int *in_stack_00000190;
  int *in_stack_000001d0;
  int *in_stack_000001e0;
  int *in_stack_000001f0;
  
  if (1 < in_EDI) {
    verbose = 1;
    **(undefined1 **)in_RSI = **(undefined1 **)in_RSI;
  }
  t_a2af(unaff_retaddr);
  t_a2tf(unaff_retaddr);
  t_ab(in_stack_00000050);
  t_ae2hd((int *)CONCAT44(in_stack_00000014,argc));
  t_af2a(in_RSI);
  t_anp((int *)0x11e6ba);
  t_anpm((int *)0x11e6c4);
  t_apcg(in_stack_00000140);
  t_apcg13(in_stack_000000f0);
  t_apci(in_stack_00000150);
  t_apci13(in_stack_000000f0);
  t_apco(in_stack_000001d0);
  t_apco13(in_stack_00000170);
  t_apcs(in_stack_00000170);
  t_apcs13(in_stack_00000120);
  t_aper(in_stack_000000e0);
  t_aper13(in_stack_000000f0);
  t_apio(in_stack_00000130);
  t_apio13(in_stack_00000160);
  t_atcc13(in_stack_00000030);
  t_atccq(in_stack_00000130);
  t_atci13(in_stack_00000040);
  t_atciq(in_stack_00000130);
  t_atciqn(in_stack_000001f0);
  t_atciqz(in_stack_00000110);
  t_atco13(in_stack_00000110);
  t_atic13(in_stack_00000020);
  t_aticq(in_stack_00000110);
  t_aticqn(in_stack_000001e0);
  t_atio13(in_stack_000000b0);
  t_atioq(in_stack_00000190);
  t_atoc13(in_stack_000000a0);
  t_atoi13(in_stack_000000a0);
  t_atoiq(in_stack_00000180);
  t_bi00(unaff_retaddr);
  t_bp00(in_stack_000000d0);
  t_bp06(in_stack_000000d0);
  t_bpn2xy(in_stack_00000040);
  t_c2i00a(in_stack_00000030);
  t_c2i00b(in_stack_00000030);
  t_c2i06a(in_stack_00000030);
  t_c2ibpn(in_stack_00000080);
  t_c2ixy(in_stack_00000040);
  t_c2ixys(in_stack_00000040);
  t_c2s((int *)CONCAT44(in_stack_00000014,argc));
  t_c2t00a(in_stack_00000060);
  t_c2t00b(in_stack_00000060);
  t_c2t06a(in_stack_00000060);
  t_c2tcio(in_stack_000000d0);
  t_c2teqx(in_stack_000000d0);
  t_c2tpe(in_stack_00000070);
  t_c2txy(in_stack_00000070);
  t_cal2jd(unaff_retaddr);
  t_cp(in_stack_00000020);
  t_cpv(in_stack_00000040);
  t_cr(in_stack_00000080);
  t_d2dtf(unaff_retaddr);
  t_d2tf(unaff_retaddr);
  t_dat(in_RSI);
  t_dtdb(in_RSI);
  t_dtf2d((int *)CONCAT44(in_stack_00000014,argc));
  t_eceq06((int *)CONCAT44(in_stack_00000014,argc));
  t_ecm06(in_stack_00000040);
  t_ee00(unaff_retaddr);
  t_ee00a(in_RSI);
  t_ee00b(in_RSI);
  t_ee06a(in_RSI);
  t_eect00(in_RSI);
  t_eform(unaff_retaddr);
  t_eo06a(in_RSI);
  t_eors(in_stack_00000040);
  t_epb(in_RSI);
  t_epb2jd(unaff_retaddr);
  t_epj(in_RSI);
  t_epj2jd(unaff_retaddr);
  t_epv00(in_stack_00000050);
  t_eqec06((int *)CONCAT44(in_stack_00000014,argc));
  t_eqeq94(in_RSI);
  t_era00(in_RSI);
  t_fad03((int *)0x11e99e);
  t_fae03((int *)0x11e9a8);
  t_faf03((int *)0x11e9b2);
  t_faju03((int *)0x11e9bc);
  t_fal03((int *)0x11e9c6);
  t_falp03((int *)0x11e9d0);
  t_fama03((int *)0x11e9da);
  t_fame03((int *)0x11e9e4);
  t_fane03((int *)0x11e9ee);
  t_faom03((int *)0x11e9f8);
  t_fapa03((int *)0x11ea02);
  t_fasa03((int *)0x11ea0c);
  t_faur03((int *)0x11ea16);
  t_fave03((int *)0x11ea20);
  t_fk425(in_stack_00000040);
  t_fk45z((int *)CONCAT44(in_stack_00000014,argc));
  t_fk524(in_stack_00000040);
  t_fk52h(in_stack_00000040);
  t_fk54z(in_stack_00000020);
  t_fk5hip(in_stack_00000050);
  t_fk5hz(unaff_retaddr);
  t_fw2m(in_stack_00000050);
  t_fw2xy((int *)CONCAT44(in_stack_00000014,argc));
  t_g2icrs(unaff_retaddr);
  t_gc2gd(in_stack_00000020);
  t_gc2gde(in_stack_00000030);
  t_gd2gc(in_stack_00000020);
  t_gd2gce(in_stack_00000030);
  t_gmst00(in_RSI);
  t_gmst06(in_RSI);
  t_gmst82(in_RSI);
  t_gst00a(in_RSI);
  t_gst00b(in_RSI);
  t_gst06(in_stack_00000040);
  t_gst06a(in_RSI);
  t_gst94(in_RSI);
  t_h2fk5(in_stack_00000040);
  t_hd2ae((int *)CONCAT44(in_stack_00000014,argc));
  t_hd2pa(unaff_retaddr);
  t_hfk5z((int *)CONCAT44(in_stack_00000014,argc));
  t_icrs2g(unaff_retaddr);
  t_ir(in_stack_00000030);
  t_jd2cal((int *)CONCAT44(in_stack_00000014,argc));
  t_jdcalf((int *)CONCAT44(in_stack_00000014,argc));
  t_ld(in_stack_00000070);
  t_ldn(in_stack_00000110);
  t_ldsun(in_stack_00000040);
  t_lteceq((int *)CONCAT44(in_stack_00000014,argc));
  t_ltecm(in_stack_00000030);
  t_lteqec((int *)CONCAT44(in_stack_00000014,argc));
  t_ltp(in_stack_00000030);
  t_ltpb(in_stack_00000030);
  t_ltpecl(unaff_retaddr);
  t_ltpequ(unaff_retaddr);
  t_moon98((int *)CONCAT44(in_stack_00000014,argc));
  t_num00a(in_stack_00000030);
  t_num00b(in_stack_00000030);
  t_num06a(in_stack_00000030);
  t_numat(in_stack_00000040);
  t_nut00a(in_RSI);
  t_nut00b(in_RSI);
  t_nut06a(in_RSI);
  t_nut80(in_RSI);
  t_nutm80(in_stack_00000030);
  t_obl06((int *)0x11ec1e);
  t_obl80(in_RSI);
  t_p06e(in_stack_000000c0);
  t_p2pv(in_stack_00000030);
  t_p2s(in_stack_00000020);
  t_pap(in_stack_00000030);
  t_pas((int *)CONCAT44(in_stack_00000014,argc));
  t_pb06(unaff_retaddr);
  t_pdp(in_stack_00000030);
  t_pfw06(unaff_retaddr);
  t_plan94(in_stack_00000020);
  t_pmat00(in_stack_00000030);
  t_pmat06(in_stack_00000030);
  t_pmat76(in_stack_00000030);
  t_pm((int *)CONCAT44(in_stack_00000014,argc));
  t_pmp(in_stack_00000040);
  t_pmpx(in_stack_00000050);
  t_pmsafe(in_stack_00000080);
  t_pn(in_stack_00000020);
  t_pn00(in_stack_00000180);
  t_pn00a(in_stack_00000190);
  t_pn00b(in_stack_00000190);
  t_pn06a(in_stack_00000190);
  t_pn06(in_stack_00000180);
  t_pnm00a(in_stack_00000030);
  t_pnm00b(in_stack_00000030);
  t_pnm06a(in_stack_00000030);
  t_pnm80(in_stack_00000030);
  t_pom00(in_stack_00000040);
  t_ppp(in_stack_00000040);
  t_ppsp(in_stack_00000040);
  t_pr00(in_RSI);
  t_prec76(in_stack_00000020);
  t_pv2p(in_stack_00000030);
  t_pv2s(in_stack_00000050);
  t_pvdpv(in_stack_00000050);
  t_pvm(in_stack_00000020);
  t_pvmpv(in_stack_00000070);
  t_pvppv(in_stack_00000070);
  t_pvstar(in_stack_00000050);
  t_pvtob(in_stack_00000050);
  t_pvu(in_stack_00000040);
  t_pvup(in_stack_00000030);
  t_pvxpv(in_stack_00000070);
  t_pxp(in_stack_00000040);
  t_refco((int *)CONCAT44(in_stack_00000014,argc));
  t_rm2v(in_stack_00000050);
  t_rv2m(in_stack_00000050);
  t_rx(in_stack_00000030);
  t_rxp(in_stack_00000070);
  t_rxpv(in_stack_00000090);
  t_rxr(in_stack_000000d0);
  t_ry(in_stack_00000030);
  t_rz(in_stack_00000030);
  t_s00a(in_RSI);
  t_s00b(in_RSI);
  t_s00(unaff_retaddr);
  t_s06a(in_RSI);
  t_s06(unaff_retaddr);
  t_s2c(unaff_retaddr);
  t_s2p(unaff_retaddr);
  t_s2pv((int *)CONCAT44(in_stack_00000014,argc));
  t_s2xpv(in_stack_00000050);
  t_sepp(in_stack_00000030);
  t_seps((int *)CONCAT44(in_stack_00000014,argc));
  t_sp00((int *)0x11eea8);
  t_starpm(in_stack_00000060);
  t_starpv(in_stack_00000050);
  t_sxp(in_stack_00000020);
  t_sxpv(in_stack_00000050);
  t_taitt(unaff_retaddr);
  t_taiut1(unaff_retaddr);
  t_taiutc(unaff_retaddr);
  t_tcbtdb(unaff_retaddr);
  t_tcgtt(unaff_retaddr);
  t_tdbtcb(unaff_retaddr);
  t_tdbtt(unaff_retaddr);
  t_tf2a(in_RSI);
  t_tf2d(in_RSI);
  t_tpors(in_stack_00000030);
  t_tporv(in_stack_00000070);
  t_tpsts((int *)CONCAT44(in_stack_00000014,argc));
  t_tpstv(in_stack_00000040);
  t_tpxes(in_stack_00000020);
  t_tpxev(in_stack_00000060);
  t_tr(in_stack_00000080);
  t_trxp(in_stack_00000070);
  t_trxpv(in_stack_00000090);
  t_tttai(unaff_retaddr);
  t_tttcg(unaff_retaddr);
  t_tttdb(unaff_retaddr);
  t_ttut1(unaff_retaddr);
  t_ut1tai(unaff_retaddr);
  t_ut1tt(unaff_retaddr);
  t_ut1utc(unaff_retaddr);
  t_utctai(unaff_retaddr);
  t_utcut1(unaff_retaddr);
  t_xy06(in_RSI);
  t_xys00a(unaff_retaddr);
  t_xys00b(unaff_retaddr);
  t_xys06a(unaff_retaddr);
  t_zp(unaff_retaddr);
  t_zpv((int *)CONCAT44(in_stack_00000014,argc));
  t_zr(in_stack_00000030);
  printf("t_sofa_c validation successful\n");
  return 0;
}

Assistant:

int main(int argc, char *argv[])
/*
**  - - - - -
**   m a i n
**  - - - - -
**
**  This revision:  2021 April 18
*/
{
   int status;


/* If any command-line argument, switch to verbose reporting. */
   if (argc > 1) {
      verbose = 1;
      argv[0][0] += 0;    /* to avoid compiler warnings */
   }

/* Preset the &status to FALSE = success. */
   status = 0;

/* Test all of the SOFA functions. */
   t_a2af(&status);
   t_a2tf(&status);
   t_ab(&status);
   t_ae2hd(&status);
   t_af2a(&status);
   t_anp(&status);
   t_anpm(&status);
   t_apcg(&status);
   t_apcg13(&status);
   t_apci(&status);
   t_apci13(&status);
   t_apco(&status);
   t_apco13(&status);
   t_apcs(&status);
   t_apcs13(&status);
   t_aper(&status);
   t_aper13(&status);
   t_apio(&status);
   t_apio13(&status);
   t_atcc13(&status);
   t_atccq(&status);
   t_atci13(&status);
   t_atciq(&status);
   t_atciqn(&status);
   t_atciqz(&status);
   t_atco13(&status);
   t_atic13(&status);
   t_aticq(&status);
   t_aticqn(&status);
   t_atio13(&status);
   t_atioq(&status);
   t_atoc13(&status);
   t_atoi13(&status);
   t_atoiq(&status);
   t_bi00(&status);
   t_bp00(&status);
   t_bp06(&status);
   t_bpn2xy(&status);
   t_c2i00a(&status);
   t_c2i00b(&status);
   t_c2i06a(&status);
   t_c2ibpn(&status);
   t_c2ixy(&status);
   t_c2ixys(&status);
   t_c2s(&status);
   t_c2t00a(&status);
   t_c2t00b(&status);
   t_c2t06a(&status);
   t_c2tcio(&status);
   t_c2teqx(&status);
   t_c2tpe(&status);
   t_c2txy(&status);
   t_cal2jd(&status);
   t_cp(&status);
   t_cpv(&status);
   t_cr(&status);
   t_d2dtf(&status);
   t_d2tf(&status);
   t_dat(&status);
   t_dtdb(&status);
   t_dtf2d(&status);
   t_eceq06(&status);
   t_ecm06(&status);
   t_ee00(&status);
   t_ee00a(&status);
   t_ee00b(&status);
   t_ee06a(&status);
   t_eect00(&status);
   t_eform(&status);
   t_eo06a(&status);
   t_eors(&status);
   t_epb(&status);
   t_epb2jd(&status);
   t_epj(&status);
   t_epj2jd(&status);
   t_epv00(&status);
   t_eqec06(&status);
   t_eqeq94(&status);
   t_era00(&status);
   t_fad03(&status);
   t_fae03(&status);
   t_faf03(&status);
   t_faju03(&status);
   t_fal03(&status);
   t_falp03(&status);
   t_fama03(&status);
   t_fame03(&status);
   t_fane03(&status);
   t_faom03(&status);
   t_fapa03(&status);
   t_fasa03(&status);
   t_faur03(&status);
   t_fave03(&status);
   t_fk425(&status);
   t_fk45z(&status);
   t_fk524(&status);
   t_fk52h(&status);
   t_fk54z(&status);
   t_fk5hip(&status);
   t_fk5hz(&status);
   t_fw2m(&status);
   t_fw2xy(&status);
   t_g2icrs(&status);
   t_gc2gd(&status);
   t_gc2gde(&status);
   t_gd2gc(&status);
   t_gd2gce(&status);
   t_gmst00(&status);
   t_gmst06(&status);
   t_gmst82(&status);
   t_gst00a(&status);
   t_gst00b(&status);
   t_gst06(&status);
   t_gst06a(&status);
   t_gst94(&status);
   t_h2fk5(&status);
   t_hd2ae(&status);
   t_hd2pa(&status);
   t_hfk5z(&status);
   t_icrs2g(&status);
   t_ir(&status);
   t_jd2cal(&status);
   t_jdcalf(&status);
   t_ld(&status);
   t_ldn(&status);
   t_ldsun(&status);
   t_lteceq(&status);
   t_ltecm(&status);
   t_lteqec(&status);
   t_ltp(&status);
   t_ltpb(&status);
   t_ltpecl(&status);
   t_ltpequ(&status);
   t_moon98(&status);
   t_num00a(&status);
   t_num00b(&status);
   t_num06a(&status);
   t_numat(&status);
   t_nut00a(&status);
   t_nut00b(&status);
   t_nut06a(&status);
   t_nut80(&status);
   t_nutm80(&status);
   t_obl06(&status);
   t_obl80(&status);
   t_p06e(&status);
   t_p2pv(&status);
   t_p2s(&status);
   t_pap(&status);
   t_pas(&status);
   t_pb06(&status);
   t_pdp(&status);
   t_pfw06(&status);
   t_plan94(&status);
   t_pmat00(&status);
   t_pmat06(&status);
   t_pmat76(&status);
   t_pm(&status);
   t_pmp(&status);
   t_pmpx(&status);
   t_pmsafe(&status);
   t_pn(&status);
   t_pn00(&status);
   t_pn00a(&status);
   t_pn00b(&status);
   t_pn06a(&status);
   t_pn06(&status);
   t_pnm00a(&status);
   t_pnm00b(&status);
   t_pnm06a(&status);
   t_pnm80(&status);
   t_pom00(&status);
   t_ppp(&status);
   t_ppsp(&status);
   t_pr00(&status);
   t_prec76(&status);
   t_pv2p(&status);
   t_pv2s(&status);
   t_pvdpv(&status);
   t_pvm(&status);
   t_pvmpv(&status);
   t_pvppv(&status);
   t_pvstar(&status);
   t_pvtob(&status);
   t_pvu(&status);
   t_pvup(&status);
   t_pvxpv(&status);
   t_pxp(&status);
   t_refco(&status);
   t_rm2v(&status);
   t_rv2m(&status);
   t_rx(&status);
   t_rxp(&status);
   t_rxpv(&status);
   t_rxr(&status);
   t_ry(&status);
   t_rz(&status);
   t_s00a(&status);
   t_s00b(&status);
   t_s00(&status);
   t_s06a(&status);
   t_s06(&status);
   t_s2c(&status);
   t_s2p(&status);
   t_s2pv(&status);
   t_s2xpv(&status);
   t_sepp(&status);
   t_seps(&status);
   t_sp00(&status);
   t_starpm(&status);
   t_starpv(&status);
   t_sxp(&status);
   t_sxpv(&status);
   t_taitt(&status);
   t_taiut1(&status);
   t_taiutc(&status);
   t_tcbtdb(&status);
   t_tcgtt(&status);
   t_tdbtcb(&status);
   t_tdbtt(&status);
   t_tf2a(&status);
   t_tf2d(&status);
   t_tpors(&status);
   t_tporv(&status);
   t_tpsts(&status);
   t_tpstv(&status);
   t_tpxes(&status);
   t_tpxev(&status);
   t_tr(&status);
   t_trxp(&status);
   t_trxpv(&status);
   t_tttai(&status);
   t_tttcg(&status);
   t_tttdb(&status);
   t_ttut1(&status);
   t_ut1tai(&status);
   t_ut1tt(&status) ;
   t_ut1utc(&status);
   t_utctai(&status);
   t_utcut1(&status);
   t_xy06(&status);
   t_xys00a(&status);
   t_xys00b(&status);
   t_xys06a(&status);
   t_zp(&status);
   t_zpv(&status);
   t_zr(&status);

/* Report, set up an appropriate exit status, and finish. */
   if (status) {
      printf("t_sofa_c validation failed!\n");
   } else {
      printf("t_sofa_c validation successful\n");
   }
   return status;
}